

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O2

void __thiscall
gimage::PNMImageIO::load
          (PNMImageIO *this,ImageU16 *image,char *name,int ds,long x,long y,long w,long h)

{
  unsigned_short ***pppuVar1;
  byte bVar2;
  short sVar3;
  int iVar4;
  uint uVar5;
  IOException *pIVar6;
  long i;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  size_t __n;
  int d;
  ulong uVar10;
  ImageU16 *pIVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  pos_type pVar15;
  int local_34c;
  ulong local_348;
  long local_340;
  long local_338;
  long local_330;
  ulong local_328;
  ImageU16 *local_320;
  long local_318;
  ulong local_310;
  ulong local_308;
  long local_300;
  ulong local_2f8;
  long local_2f0;
  int depth;
  valarray<int> nline;
  valarray<int> vline;
  long local_2a0;
  __mbstate_t local_298;
  long height;
  long width;
  long local_278;
  long local_270;
  ulong local_268;
  long local_260;
  ulong local_258;
  ulong local_250;
  long maxval;
  float scale;
  ifstream in;
  
  local_340 = x;
  local_330 = y;
  local_320 = image;
  iVar4 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,1);
  if ((char)iVar4 == '\0') {
    pIVar6 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&nline,name,(allocator *)&local_34c);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vline,
                   "Can only load PNM image (",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nline);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vline,")");
    gutil::IOException::IOException(pIVar6,(string *)&in);
    __cxa_throw(pIVar6,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  pVar15 = anon_unknown_11::readPNMHeader(name,&depth,&maxval,&scale,&width,&height);
  pIVar11 = local_320;
  if ((scale == 0.0) && (!NAN(scale))) {
    if (maxval < 0x100) {
      Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image
                ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&in,0,0,1);
      (*(this->super_BasicImageIO)._vptr_BasicImageIO[6])
                (this,(Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&in,name,
                 (ulong)(uint)ds,local_340,local_330,w,h);
      Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setImageLimited<unsigned_char>
                (local_320,(Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&in);
      Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image
                ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&in);
    }
    else {
      local_348 = 1;
      if (1 < ds) {
        local_348 = (ulong)(uint)ds;
      }
      if (w < 0) {
        w = (long)(width + local_348 + -1) / (long)local_348;
      }
      if (h < 0) {
        h = (long)(height + local_348 + -1) / (long)local_348;
      }
      local_328 = (ulong)depth;
      Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize(local_320,w,h,local_328);
      lVar8 = pIVar11->n;
      lVar13 = -lVar8;
      if (0 < lVar8) {
        lVar13 = lVar8;
      }
      memset(pIVar11->pixel,0,lVar13 * 2);
      std::ifstream::ifstream(&in);
      std::ios::exceptions((int)&in + (int)*(undefined8 *)(_in + -0x18));
      std::ifstream::open((char *)&in,(_Ios_Openmode)name);
      local_338 = width;
      local_300 = height;
      local_2a0 = pVar15._M_off;
      local_298 = pVar15._M_state;
      local_2f8 = w;
      if ((((ds < 2) && (local_330 == 0 && local_340 == 0)) && (w == width)) && (h == height)) {
        std::istream::seekg(&in,local_2a0,local_298);
        uVar12 = 0;
        uVar9 = local_328 & 0xffffffff;
        if ((int)local_328 < 1) {
          uVar9 = uVar12;
        }
        if (w < 1) {
          local_2f8 = uVar12;
        }
        local_308 = h;
        if (h < 1) {
          local_308 = uVar12;
        }
        for (; uVar12 != local_308; uVar12 = uVar12 + 1) {
          for (uVar7 = 0; uVar7 != local_2f8; uVar7 = uVar7 + 1) {
            for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
              sVar3 = std::streambuf::sbumpc();
              bVar2 = std::streambuf::sbumpc();
              local_320->img[uVar10][uVar12][uVar7] = (ushort)bVar2 | sVar3 << 8;
            }
          }
        }
      }
      else {
        nline._M_size._0_4_ = 0;
        __n = w * local_328;
        local_308 = h;
        std::valarray<int>::valarray(&vline,(int *)&nline,__n);
        local_34c = 0;
        std::valarray<int>::valarray(&nline,&local_34c,__n);
        uVar12 = 0;
        uVar9 = -local_330;
        if (-local_330 == 0 || 0 < local_330) {
          uVar9 = uVar12;
        }
        local_270 = 0;
        if (0 < local_340) {
          local_270 = local_340;
        }
        local_270 = local_270 * local_348;
        local_278 = local_328 * 2;
        local_310 = -local_340;
        if (-local_340 == 0 || 0 < local_340) {
          local_310 = uVar12;
        }
        local_318 = local_310 * local_328;
        if (0 < (int)local_328) {
          uVar12 = local_328 & 0xffffffff;
        }
        while (((long)uVar9 < (long)local_308 &&
               (local_260 = (uVar9 + local_330) * local_348, local_260 < local_300))) {
          local_34c = 0;
          std::valarray<int>::operator=(&vline,&local_34c);
          local_34c = 0;
          std::valarray<int>::operator=(&nline,&local_34c);
          uVar7 = 0;
          local_268 = uVar9;
          while ((lVar8 = local_318, uVar9 = local_310, uVar7 != local_348 &&
                 (local_258 = uVar7, (long)(uVar7 + local_260) < local_300))) {
            std::istream::seekg(&in,((uVar7 + local_260) * local_338 + local_270) * local_278 +
                                    local_2a0,local_298);
            local_2f0 = local_318;
            uVar9 = local_310;
            while (((long)uVar9 < w && (lVar8 = (uVar9 + local_340) * local_348, lVar8 < local_338))
                  ) {
              local_250 = uVar9;
              for (uVar7 = 0;
                  (uVar7 < local_348 &&
                  (uVar9 = uVar12, lVar13 = local_2f0, (long)(lVar8 + uVar7) < local_338));
                  uVar7 = uVar7 + 1) {
                while (bVar14 = uVar9 != 0, uVar9 = uVar9 - 1, bVar14) {
                  uVar5 = std::streambuf::sbumpc();
                  bVar2 = std::streambuf::sbumpc();
                  vline._M_data[lVar13] =
                       vline._M_data[lVar13] + ((uVar5 & 0xff) << 8 | (uint)bVar2);
                  nline._M_data[lVar13] = nline._M_data[lVar13] + 1;
                  lVar13 = lVar13 + 1;
                }
              }
              local_2f0 = local_2f0 + local_328;
              pIVar11 = local_320;
              w = local_2f8;
              uVar9 = local_250 + 1;
            }
            uVar7 = local_258 + 1;
          }
          for (; ((long)uVar9 < w && ((long)((local_340 + uVar9) * local_348) < local_338));
              uVar9 = uVar9 + 1) {
            pppuVar1 = pIVar11->img;
            for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
              if (0 < nline._M_data[lVar8 + uVar7]) {
                pppuVar1[uVar7][local_268][uVar9] =
                     (unsigned_short)(vline._M_data[lVar8 + uVar7] / nline._M_data[lVar8 + uVar7]);
              }
            }
            lVar8 = lVar8 + uVar7;
          }
          uVar9 = local_268 + 1;
        }
        operator_delete(nline._M_data);
        operator_delete(vline._M_data);
      }
      std::ifstream::close();
      std::ifstream::~ifstream(&in);
    }
    return;
  }
  pIVar6 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&nline,name,(allocator *)&local_34c);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vline,
                 "A float image cannot be loaded as 16 bit image (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nline);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vline,")");
  gutil::IOException::IOException(pIVar6,(string *)&in);
  __cxa_throw(pIVar6,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void PNMImageIO::load(ImageU16 &image, const char *name, int ds, long x,
                      long y, long w, long h) const
{
  long  width, height, maxval;
  float scale;
  int   depth;
  std::istream::pos_type pos;

  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load PNM image ("+std::string(name)+")");
  }

  pos=readPNMHeader(name, depth, maxval, scale, width, height);

  if (scale != 0)
  {
    throw gutil::IOException("A float image cannot be loaded as 16 bit image ("+std::string(name)+")");
  }

  if (maxval > 255)
  {
    ds=std::max(1, ds);

    if (w < 0)
    {
      w=(width+ds-1)/ds;
    }

    if (h < 0)
    {
      h=(height+ds-1)/ds;
    }

    image.setSize(w, h, depth);
    image.clear();

    try
    {
      std::ifstream in;
      in.exceptions(std::ios_base::failbit | std::ios_base::badbit | std::ios_base::eofbit);
      in.open(name, std::ios::binary);

      // load downscaled part?

      if (ds > 1 || x != 0 || y != 0 || w != width || h != height)
      {
        std::valarray<ImageU16::work_t> vline(0, w*depth);
        std::valarray<int> nline(0, w*depth);

        for (long k=std::max(0l, -y); k<h && (y+k)*ds<height; k++)
        {
          // load downscaled line

          vline=0;
          nline=0;

          for (long kk=0; kk<ds && kk+(y+k)*ds<height; kk++)
          {
            in.seekg(pos+static_cast<std::streamoff>((y+k)*ds+kk)*width*depth*2+
                     static_cast<std::streamoff>(std::max(0l, x))*ds*depth*2);

            std::streambuf *sb=in.rdbuf();

            long j=std::max(0l, -x)*depth;

            for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
            {
              for (int ii=0; ii<ds && (x+i)*ds+ii<width; ii++)
              {
                for (int d=0; d<depth; d++)
                {
                  ImageU16::store_t v;

                  v=(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);
                  v=(v<<8)|(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);

                  if (image.isValidS(v))
                  {
                    vline[j+d]+=v;
                    nline[j+d]++;
                  }
                }
              }

              j+=depth;
            }
          }

          // store line into image

          long j=std::max(0l, -x)*depth;

          for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
          {
            for (int d=0; d<depth; d++)
            {
              if (nline[j] > 0)
              {
                image.set(i, k, d, static_cast<ImageU16::store_t>(vline[j]/nline[j]));
              }

              j++;
            }
          }
        }
      }
      else // load whole image
      {
        in.seekg(pos);
        std::streambuf *sb=in.rdbuf();

        for (long k=0; k<height; k++)
        {
          for (long i=0; i<width; i++)
          {
            for (int d=0; d<depth; d++)
            {
              ImageU16::store_t v;

              v=(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);
              v=(v<<8)|(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);

              image.set(i, k, d, v);
            }
          }
        }
      }

      in.close();
    }
    catch (const std::ios_base::failure &ex)
    {
      throw gutil::IOException(ex.what());
    }
  }
  else
  {
    ImageU8 imageu8;
    load(imageu8, name, ds, x, y, w, h);
    image.setImageLimited(imageu8);
  }
}